

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffgiprll(fitsfile *infptr,int maxaxis,int *bitpix,int *naxis,LONGLONG *naxes,int *status)

{
  if (0 < *status) {
    return *status;
  }
  if (bitpix != (int *)0x0) {
    ffgidt(infptr,bitpix,status);
  }
  if (naxis != (int *)0x0) {
    ffgidm(infptr,naxis,status);
  }
  if (naxes != (LONGLONG *)0x0) {
    ffgiszll(infptr,maxaxis,naxes,status);
  }
  return *status;
}

Assistant:

int ffgiprll(fitsfile *infptr,   /* I - FITS file pointer                   */
        int maxaxis,           /* I - max number of axes to return          */
        int *bitpix,           /* O - image data type                       */
        int *naxis,            /* O - image dimension (NAXIS value)         */
        LONGLONG *naxes,       /* O - size of image dimensions              */
        int *status)           /* IO - error status      */

/*
    get the datatype and size of the input image
*/
{

    if (*status > 0)
        return(*status);

    /* don't return the parameter if a null pointer was given */

    if (bitpix)
      fits_get_img_type(infptr, bitpix, status);  /* get BITPIX value */

    if (naxis)
      fits_get_img_dim(infptr, naxis, status);    /* get NAXIS value */

    if (naxes)
      fits_get_img_sizell(infptr, maxaxis, naxes, status); /* get NAXISn values */

    return(*status);
}